

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::
InterCellPositivelyInclinedTwoShortHLinesProducePositiveCoverAndArea(VectorRasterizerTests *this)

{
  allocator local_f9;
  string local_f8;
  cell reference2 [2];
  LocationInfo local_c0;
  cell reference1 [2];
  vector_rasterizer vr;
  
  vector_rasterizer::vector_rasterizer(&vr);
  vector_rasterizer::line(&vr,0x133,-0x1e6,0x14d,-0x40);
  reference1[0].x = 1;
  reference1[0].y = -2;
  reference1[0].area = 0x6838;
  reference1._8_8_ = 0x6a80ffff000100e6;
  reference1[1]._6_4_ = 0xc00000;
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)reference2);
  ut::LocationInfo::LocationInfo(&local_c0,&local_f8,0x332);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            (&reference1,&vr._cells,&local_c0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&vr);
  vector_rasterizer::line(&vr,0x33,0x1e6,0x80,0x245);
  reference2[0].x = 0;
  reference2[0].y = 1;
  reference2[0].area = 0xc7e;
  reference2._8_8_ = 0x35e800020000001a;
  reference2[1]._6_4_ = 0x450000;
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_f9);
  ut::LocationInfo::LocationInfo(&local_c0,&local_f8,0x340);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            (&reference2,&vr._cells,&local_c0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&vr);
  return;
}

Assistant:

test( InterCellPositivelyInclinedTwoShortHLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (ctg = 252)
				vr.line(fp(1.2), fp(-1.9), fp(1.3), fp(-0.25)); // in fp - [(307, -486); (333, -64)), v(26, 422)

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 1, -2, 26680, 230 }, // dx = 14
					{ 1, -1, 27264, 192 }, // dx = 12
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT (ctg = 3319)
				vr.line(fp(0.2), fp(1.9), fp(0.5), fp(2.27)); // in fp - [(51, 486); (128, 581)), v(77, 95)

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 0, 1, 3198, 26 }, // dx = 21
					{ 0, 2, 13800, 69 }, // dx = 56
				};

				assert_equal(reference2, vr.cells());
			}